

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lws_dll2.c
# Opt level: O2

void lws_dll2_add_sorted(lws_dll2_t *d,lws_dll2_owner_t *own,
                        _func_int_lws_dll2_t_ptr_lws_dll2_t_ptr *compare)

{
  lws_dll2 *plVar1;
  int iVar2;
  lws_dll2 *after;
  
  plVar1 = own->head;
  while( true ) {
    after = plVar1;
    if (after == (lws_dll2 *)0x0) {
      lws_dll2_add_tail(d,own);
      return;
    }
    if (after == d) break;
    plVar1 = after->next;
    iVar2 = (*compare)(after,d);
    if (-1 < iVar2) {
      lws_dll2_add_before(d,after);
      return;
    }
  }
  __assert_fail("p != d",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dmikushin[P]libwebsockets/lib/core/lws_dll2.c"
                ,0xc0,
                "void lws_dll2_add_sorted(lws_dll2_t *, lws_dll2_owner_t *, int (*)(const lws_dll2_t *, const lws_dll2_t *))"
               );
}

Assistant:

void
lws_dll2_add_sorted(lws_dll2_t *d, lws_dll2_owner_t *own,
		    int (*compare)(const lws_dll2_t *d, const lws_dll2_t *i))
{
	lws_start_foreach_dll_safe(struct lws_dll2 *, p, tp,
				   lws_dll2_get_head(own)) {
		assert(p != d);

		if (compare(p, d) >= 0) {
			/* drop us in before this guy */
			lws_dll2_add_before(d, p);

			// lws_dll2_describe(own, "post-insert");

			return;
		}
	} lws_end_foreach_dll_safe(p, tp);

	/*
	 * Either nobody on the list yet to compare him to, or he's the
	 * furthest away timeout... stick him at the tail end
	 */

	lws_dll2_add_tail(d, own);
}